

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

int __thiscall nite::Batch::init(Batch *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppBVar1;
  float fVar2;
  iterator __position;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int in_EAX;
  GLuint GVar5;
  int iVar6;
  ulong uVar7;
  pointer pBVar8;
  int in_EDX;
  ulong uVar9;
  Batch *local_80 [2];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer ppBStack_48;
  pointer local_40;
  float local_38;
  float local_34;
  
  local_34 = (float)(int)ctx;
  if (-1 < this->objectId) {
    fVar2 = (this->size).x;
    if ((fVar2 == local_34) && (!NAN(fVar2) && !NAN(local_34))) {
      fVar2 = (this->size).y;
      if ((fVar2 == (float)in_EDX) && (!NAN(fVar2) && !NAN((float)in_EDX))) {
        return in_EAX;
      }
    }
    unload(this);
  }
  uVar9 = ((long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if ((batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data
        ._M_start)->empty == false) {
      uVar7 = 0;
      pBVar8 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pBVar8 = pBVar8 + 1;
        if ((uVar9 + (uVar9 == 0)) - 1 == uVar7) goto LAB_00179e47;
        uVar7 = uVar7 + 1;
      } while (pBVar8->empty == false);
      bVar3 = uVar7 <= uVar9 && uVar9 - uVar7 != 0;
    }
    else {
      bVar3 = true;
      uVar7 = 0;
    }
    iVar6 = (int)uVar7;
    if (bVar3) goto LAB_00179e9a;
  }
LAB_00179e47:
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&((BatchT *)local_80)->hash + 0x10);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = (pointer)0x0;
  ppBStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_80[0] = (Batch *)CONCAT71(local_80[0]._1_7_,true);
  local_70._M_p = (pointer)paVar4;
  std::vector<BatchT,_std::allocator<BatchT>_>::emplace_back<BatchT>(&batches,(BatchT *)local_80);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != paVar4) {
    operator_delete(local_70._M_p);
  }
  iVar6 = (int)uVar9;
LAB_00179e9a:
  this->objectId = iVar6;
  pBVar8 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar6].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_80[0] = this;
  if (__position._M_current ==
      batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<nite::Batch*,std::allocator<nite::Batch*>>::_M_realloc_insert<nite::Batch*>
              ((vector<nite::Batch*,std::allocator<nite::Batch*>> *)
               &batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                super__Vector_impl_data._M_start[iVar6].owners,__position,(Batch **)local_80);
  }
  else {
    *__position._M_current = this;
    pppBVar1 = &pBVar8[iVar6].owners.
                super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
  _M_start[this->objectId].empty = false;
  local_38 = (float)in_EDX;
  Vec2::set(&this->size,local_34,local_38);
  Rect::set(&this->region,0.0,0.0,local_34,local_38);
  Vec2::set(&this->scale,1.0,1.0);
  (*__glewGenFramebuffers)
            (1,&batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                super__Vector_impl_data._M_start[this->objectId].framebufferId);
  (*__glewBindFramebuffer)
            (0x8d40,batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                    super__Vector_impl_data._M_start[this->objectId].framebufferId);
  GVar5 = createTexture((int)ctx,in_EDX);
  batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
  _M_start[this->objectId].textureId = GVar5;
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,GVar5,0);
  iVar6 = (*__glewBindFramebuffer)(0x8d40,0);
  return iVar6;
}

Assistant:

void nite::Batch::init(int w, int h){
	if(objectId >= 0){
		if(w == size.x && h == size.y){
			return;
		}
		unload();
	}
	objectId = getEmptySlot();
	batches[objectId].owners.push_back(this);
	batches[objectId].empty = false;
	size.set(w, h);
	region.set(0, 0, w, h);
	scale.set(1.0f, 1.0f);
	glGenFramebuffers(1, &batches[objectId].framebufferId);
	glBindFramebuffer(GL_FRAMEBUFFER, batches[objectId].framebufferId);
	batches[objectId].textureId = createTexture(w, h);
	glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, batches[objectId].textureId, 0);
	glBindFramebuffer(GL_FRAMEBUFFER, 0);
}